

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O1

bool slang::analysis::ClockInference::isSampledValueFuncCall(Expression *expr)

{
  char *pcVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  KnownSystemName KVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  value_type *elements;
  ulong uVar9;
  uint uVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  undefined1 auVar15 [16];
  
  if (expr->kind != Call) {
    return false;
  }
  KVar5 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(int)KVar5;
  uVar6 = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
          SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar7 = uVar6 >> (SampleValueFuncNames & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar6 & 0xff];
  uVar9 = 0;
  do {
    pcVar1 = (char *)(DAT_00600708 + uVar7 * 0x10);
    cVar11 = (char)uVar2;
    auVar15[0] = -(*pcVar1 == cVar11);
    cVar12 = (char)((uint)uVar2 >> 8);
    auVar15[1] = -(pcVar1[1] == cVar12);
    cVar13 = (char)((uint)uVar2 >> 0x10);
    auVar15[2] = -(pcVar1[2] == cVar13);
    cVar14 = (char)((uint)uVar2 >> 0x18);
    auVar15[3] = -(pcVar1[3] == cVar14);
    auVar15[4] = -(pcVar1[4] == cVar11);
    auVar15[5] = -(pcVar1[5] == cVar12);
    auVar15[6] = -(pcVar1[6] == cVar13);
    auVar15[7] = -(pcVar1[7] == cVar14);
    auVar15[8] = -(pcVar1[8] == cVar11);
    auVar15[9] = -(pcVar1[9] == cVar12);
    auVar15[10] = -(pcVar1[10] == cVar13);
    auVar15[0xb] = -(pcVar1[0xb] == cVar14);
    auVar15[0xc] = -(pcVar1[0xc] == cVar11);
    auVar15[0xd] = -(pcVar1[0xd] == cVar12);
    auVar15[0xe] = -(pcVar1[0xe] == cVar13);
    auVar15[0xf] = -(pcVar1[0xf] == cVar14);
    uVar10 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
    if (uVar10 != 0) {
      lVar8 = DAT_00600710 + uVar7 * 0x3c;
      do {
        uVar3 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        if (KVar5 == *(KnownSystemName *)(lVar8 + (ulong)uVar3 * 4)) {
          return lVar8 + (ulong)uVar3 * 4 != 0;
        }
        uVar10 = uVar10 - 1 & uVar10;
      } while (uVar10 != 0);
    }
    if ((*(byte *)(uVar7 * 0x10 + DAT_00600708 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar6 & 7]) == 0) {
      return false;
    }
    lVar8 = uVar7 + uVar9;
    uVar9 = uVar9 + 1;
    uVar7 = lVar8 + 1U & DAT_00600700;
  } while (uVar9 <= DAT_00600700);
  return false;
}

Assistant:

bool ClockInference::isSampledValueFuncCall(const Expression& expr) {
    if (expr.kind == ExpressionKind::Call)
        return SampleValueFuncNames.contains(expr.as<CallExpression>().getKnownSystemName());
    return false;
}